

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

bool __thiscall
crnlib::rg_etc1::etc1_optimizer::evaluate_solution_fast
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 aVar1;
  params *ppVar2;
  color_quad_u8 *pcVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint s;
  long lVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  color_quad_u8 base_color;
  uint block_inten_midpoints [3];
  color_quad_u8 block_colors [4];
  uint block_inten [4];
  
  ppVar2 = this->m_pParams;
  if (ppVar2->m_constrain_against_base_color5 == true) {
    iVar5 = (uint)(coords->m_unscaled_color).field_0.field_0.r -
            (uint)(ppVar2->m_base_color5).field_0.field_0.r;
    iVar8 = (uint)(coords->m_unscaled_color).field_0.field_0.g -
            (uint)(ppVar2->m_base_color5).field_0.field_0.g;
    iVar7 = (uint)(coords->m_unscaled_color).field_0.field_0.b -
            (uint)(ppVar2->m_base_color5).field_0.field_0.b;
    iVar11 = iVar8;
    if (iVar5 < iVar8) {
      iVar11 = iVar5;
    }
    if (iVar7 <= iVar11) {
      iVar11 = iVar7;
    }
    if (-5 < iVar11) {
      if (iVar8 < iVar5) {
        iVar8 = iVar5;
      }
      if (iVar8 <= iVar7) {
        iVar8 = iVar7;
      }
      if (iVar8 < 4) goto LAB_00174986;
    }
    trial_solution->m_valid = false;
  }
  else {
LAB_00174986:
    etc1_solution_coordinates::get_scaled_color((etc1_solution_coordinates *)&base_color);
    trial_solution->m_error = 0xffffffffffffffff;
    uVar16 = 0xffffffffffffffff;
    for (uVar14 = 7; -1 < (int)uVar14; uVar14 = uVar14 - 1) {
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        iVar11 = (&g_etc1_inten_tables)[lVar9 + (ulong)uVar14 * 4];
        uVar13 = iVar11 + (uint)base_color.field_0.field_0.r;
        uVar10 = iVar11 + (uint)base_color.field_0.field_0.g;
        iVar11 = iVar11 + (uint)base_color.field_0.field_0.b;
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        if (0xfe < (int)uVar13) {
          uVar13 = 0xff;
        }
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        if (0xfe < (int)uVar10) {
          uVar10 = 0xff;
        }
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        block_colors[lVar9].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad_u8_0)(uVar10 << 8 | iVar11 << 0x10 | uVar13);
        block_inten[lVar9] = uVar10 + uVar13 + iVar11;
      }
      block_inten_midpoints[0] = block_inten[1] + block_inten[0];
      block_inten_midpoints[1] = block_inten[1] + block_inten[2];
      block_inten_midpoints[2] = block_inten[2] + block_inten[3];
      pcVar3 = this->m_pParams->m_pSrc_pixels;
      uVar13 = this->m_pSorted_luma[7];
      if (uVar13 * 2 < block_inten[1] + block_inten[0]) {
        if ((block_inten[0] < uVar13 || block_inten[0] - uVar13 == 0) ||
           (block_inten[0] - uVar13 < uVar16)) {
          this->m_temp_selectors[0] = '\0';
          this->m_temp_selectors[1] = '\0';
          this->m_temp_selectors[2] = '\0';
          this->m_temp_selectors[3] = '\0';
          this->m_temp_selectors[4] = '\0';
          this->m_temp_selectors[5] = '\0';
          this->m_temp_selectors[6] = '\0';
          this->m_temp_selectors[7] = '\0';
          uVar12 = 0;
          for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 4) {
            uVar6 = color_quad_u8::squared_distance_rgb
                              (block_colors,(color_quad_u8 *)((long)&pcVar3->field_0 + lVar9));
            uVar12 = uVar12 + uVar6;
          }
          goto LAB_00174bc9;
        }
      }
      else {
        uVar13 = *this->m_pSorted_luma;
        if (uVar13 * 2 < block_inten[2] + block_inten[3]) {
          uVar12 = 0;
          uVar15 = 0;
          for (uVar16 = 0; uVar16 != 8; uVar16 = uVar16 + 1) {
            while (block_inten_midpoints[uVar15] <= this->m_pSorted_luma[uVar16] * 2) {
              uVar13 = (int)uVar15 + 1;
              uVar15 = (ulong)uVar13;
              if (2 < uVar13) {
                uVar16 = uVar16 & 0xffffffff;
                goto LAB_00174bc3;
              }
            }
            uVar13 = this->m_pSorted_luma_indices[uVar16];
            this->m_temp_selectors[uVar13] = (uint8)uVar15;
            uVar6 = color_quad_u8::squared_distance_rgb(block_colors + uVar15,pcVar3 + uVar13);
            uVar12 = uVar12 + uVar6;
          }
          uVar16 = 8;
LAB_00174bc3:
          for (; uVar16 != 8; uVar16 = uVar16 + 1) {
            uVar13 = this->m_pSorted_luma_indices[uVar16];
            this->m_temp_selectors[uVar13] = '\x03';
            uVar6 = color_quad_u8::squared_distance_rgb(block_colors + 3,pcVar3 + uVar13);
            uVar12 = uVar12 + uVar6;
          }
        }
        else {
          if ((block_inten[3] <= uVar13 && uVar13 - block_inten[3] != 0) &&
             (uVar16 <= uVar13 - block_inten[3])) goto LAB_00174c06;
          builtin_memcpy(this->m_temp_selectors,"\x03\x03\x03\x03\x03\x03\x03\x03",8);
          uVar12 = 0;
          for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 4) {
            uVar6 = color_quad_u8::squared_distance_rgb
                              (block_colors + 3,(color_quad_u8 *)((long)&pcVar3->field_0 + lVar9));
            uVar12 = uVar12 + uVar6;
          }
        }
LAB_00174bc9:
        uVar16 = trial_solution->m_error;
        if (uVar12 < trial_solution->m_error) {
          trial_solution->m_error = uVar12;
          (trial_solution->m_coords).m_inten_table = uVar14;
          *(undefined8 *)trial_solution->m_selectors = *(undefined8 *)this->m_temp_selectors;
          trial_solution->m_valid = true;
          uVar16 = uVar12;
          if (uVar12 == 0) {
            uVar16 = 0;
            break;
          }
        }
      }
LAB_00174c06:
    }
    aVar1 = (coords->m_unscaled_color).field_0;
    (trial_solution->m_coords).m_unscaled_color.field_0 = aVar1;
    (trial_solution->m_coords).m_color4 = this->m_pParams->m_use_color4;
    if ((pBest_solution != (potential_solution *)0x0) && (uVar16 < pBest_solution->m_error)) {
      (pBest_solution->m_coords).m_unscaled_color.field_0 = aVar1;
      (pBest_solution->m_coords).m_inten_table = (trial_solution->m_coords).m_inten_table;
      (pBest_solution->m_coords).m_color4 = (trial_solution->m_coords).m_color4;
      uVar4 = *(undefined8 *)&trial_solution->field_0x14;
      *(undefined8 *)pBest_solution->m_selectors = *(undefined8 *)trial_solution->m_selectors;
      *(undefined8 *)&pBest_solution->field_0x14 = uVar4;
      *(undefined8 *)((long)&pBest_solution->m_error + 1) =
           *(undefined8 *)((long)&trial_solution->m_error + 1);
      return true;
    }
  }
  return false;
}

Assistant:

bool etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution) {
  if (m_pParams->m_constrain_against_base_color5) {
    const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
    const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
    const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

    if ((rg_etc1::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (rg_etc1::maximum(dr, dg, db) > cETC1ColorDeltaMax)) {
      trial_solution.m_valid = false;
      return false;
    }
  }

  const color_quad_u8 base_color(coords.get_scaled_color());

  const uint n = 8;

  trial_solution.m_error = cUINT64_MAX;

  for (int inten_table = cETC1IntenModifierValues - 1; inten_table >= 0; --inten_table) {
    const int* pInten_table = g_etc1_inten_tables[inten_table];

    uint block_inten[4];
    color_quad_u8 block_colors[4];
    for (uint s = 0; s < 4; s++) {
      const int yd = pInten_table[s];
      color_quad_u8 block_color(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
      block_colors[s] = block_color;
      block_inten[s] = block_color.r + block_color.g + block_color.b;
    }

    // evaluate_solution_fast() enforces/assumesd a total ordering of the input colors along the intensity (1,1,1) axis to more quickly classify the inputs to selectors.
    // The inputs colors have been presorted along the projection onto this axis, and ETC1 block colors are always ordered along the intensity axis, so this classification is fast.
    // 0   1   2   3
    //   01  12  23
    const uint block_inten_midpoints[3] = {block_inten[0] + block_inten[1], block_inten[1] + block_inten[2], block_inten[2] + block_inten[3]};

    uint64 total_error = 0;
    const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
    if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0]) {
      if (block_inten[0] > m_pSorted_luma[n - 1]) {
        const uint min_error = block_inten[0] - m_pSorted_luma[n - 1];
        if (min_error >= trial_solution.m_error)
          continue;
      }

      memset(&m_temp_selectors[0], 0, n);

      for (uint c = 0; c < n; c++)
        total_error += block_colors[0].squared_distance_rgb(pSrc_pixels[c]);
    } else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2]) {
      if (m_pSorted_luma[0] > block_inten[3]) {
        const uint min_error = m_pSorted_luma[0] - block_inten[3];
        if (min_error >= trial_solution.m_error)
          continue;
      }

      memset(&m_temp_selectors[0], 3, n);

      for (uint c = 0; c < n; c++)
        total_error += block_colors[3].squared_distance_rgb(pSrc_pixels[c]);
    } else {
      uint cur_selector = 0, c;
      for (c = 0; c < n; c++) {
        const uint y = m_pSorted_luma[c];
        while ((y * 2) >= block_inten_midpoints[cur_selector])
          if (++cur_selector > 2)
            goto done;
        const uint sorted_pixel_index = m_pSorted_luma_indices[c];
        m_temp_selectors[sorted_pixel_index] = static_cast<uint8>(cur_selector);
        total_error += block_colors[cur_selector].squared_distance_rgb(pSrc_pixels[sorted_pixel_index]);
      }
    done:
      while (c < n) {
        const uint sorted_pixel_index = m_pSorted_luma_indices[c];
        m_temp_selectors[sorted_pixel_index] = 3;
        total_error += block_colors[3].squared_distance_rgb(pSrc_pixels[sorted_pixel_index]);
        ++c;
      }
    }

    if (total_error < trial_solution.m_error) {
      trial_solution.m_error = total_error;
      trial_solution.m_coords.m_inten_table = inten_table;
      memcpy(trial_solution.m_selectors, m_temp_selectors, n);
      trial_solution.m_valid = true;
      if (!total_error)
        break;
    }
  }
  trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
  trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

  bool success = false;
  if (pBest_solution) {
    if (trial_solution.m_error < pBest_solution->m_error) {
      *pBest_solution = trial_solution;
      success = true;
    }
  }

  return success;
}